

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O0

void get_thickness_adjustments
               (Am_Style *ls,int *lt_adjustment,int *rb_adjustment,int *wh_adjustment)

{
  bool bVar1;
  short local_2e;
  Am_Line_Cap_Style_Flag local_2c;
  short thickness;
  int *piStack_28;
  Am_Line_Cap_Style_Flag cap;
  int *wh_adjustment_local;
  int *rb_adjustment_local;
  int *lt_adjustment_local;
  Am_Style *ls_local;
  
  piStack_28 = wh_adjustment;
  wh_adjustment_local = rb_adjustment;
  rb_adjustment_local = lt_adjustment;
  lt_adjustment_local = (int *)ls;
  bVar1 = Am_Style::Valid(ls);
  if (bVar1) {
    Am_Style::Get_Line_Thickness_Values((Am_Style *)lt_adjustment_local,&local_2e,&local_2c);
    if (local_2e == 0) {
      local_2e = 1;
    }
    if (local_2c == Am_CAP_PROJECTING) {
      *rb_adjustment_local = (int)local_2e;
      *wh_adjustment_local = (int)local_2e;
      *piStack_28 = (int)local_2e << 1;
    }
    else {
      *rb_adjustment_local = (int)local_2e / 2;
      *wh_adjustment_local = (local_2e + 1) / 2;
      *piStack_28 = (int)local_2e;
    }
  }
  else {
    *rb_adjustment_local = 0;
    *wh_adjustment_local = 0;
    *piStack_28 = 1;
  }
  return;
}

Assistant:

void
get_thickness_adjustments(const Am_Style &ls, int &lt_adjustment,
                          int &rb_adjustment, int &wh_adjustment)
{
  if (ls.Valid()) {
    Am_Line_Cap_Style_Flag cap;
    short thickness;
    ls.Get_Line_Thickness_Values(thickness, cap);
    thickness = thickness ? thickness : 1;
    if (cap == Am_CAP_PROJECTING) {
      lt_adjustment = thickness;
      rb_adjustment = thickness;
      wh_adjustment = (2 * thickness);
    } else {
      lt_adjustment = thickness / 2;
      rb_adjustment = (thickness + 1) / 2;
      wh_adjustment = thickness;
    }
  } else {
    lt_adjustment = 0;
    rb_adjustment = 0;
    wh_adjustment = 1;
  }
}